

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_upscale(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  long lVar2;
  ggml_tensor *pgVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  char *pcVar26;
  int64_t i1;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  undefined8 uVar30;
  int64_t i0;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  int64_t i0_1;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  long local_d0;
  long local_c8;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    pcVar26 = "fatal error";
    uVar30 = 0x19d0;
LAB_0013faf3:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar30,pcVar26);
  }
  sVar4 = pgVar3->nb[1];
  sVar5 = pgVar3->nb[3];
  lVar6 = dst->ne[2];
  sVar7 = pgVar3->nb[2];
  sVar8 = dst->nb[0];
  lVar33 = (long)params->ith;
  lVar35 = (long)params->nth;
  sVar9 = pgVar3->nb[0];
  sVar10 = dst->nb[2];
  uVar11 = dst->ne[0];
  uVar12 = dst->ne[1];
  uVar13 = dst->ne[3];
  sVar14 = dst->nb[1];
  fVar41 = (float)(long)uVar11 / (float)pgVar3->ne[0];
  fVar42 = (float)(long)uVar12 / (float)pgVar3->ne[1];
  sVar15 = dst->nb[3];
  fVar43 = (float)lVar6 / (float)pgVar3->ne[2];
  fVar44 = (float)(long)uVar13 / (float)pgVar3->ne[3];
  if (dst->op_params[0] == 0) {
    local_d0 = lVar33 * sVar10;
    for (uVar32 = 0; uVar32 != (~((long)uVar13 >> 0x3f) & uVar13); uVar32 = uVar32 + 1) {
      lVar34 = local_d0;
      for (lVar22 = lVar33; lVar22 < lVar6; lVar22 = lVar22 + lVar35) {
        lVar37 = lVar34;
        for (uVar25 = 0; uVar25 != (~((long)uVar12 >> 0x3f) & uVar12); uVar25 = uVar25 + 1) {
          lVar36 = lVar37;
          for (uVar40 = 0; (~((long)uVar11 >> 0x3f) & uVar11) != uVar40; uVar40 = uVar40 + 1) {
            *(undefined4 *)((long)dst->data + lVar36) =
                 *(undefined4 *)
                  ((long)pgVar3->data +
                  (long)((float)(long)uVar32 / fVar44) * sVar5 +
                  (long)((float)(long)uVar25 / fVar42) * sVar4 +
                  (long)((float)lVar22 / fVar43) * sVar7 +
                  (long)((float)(long)uVar40 / fVar41) * sVar9);
            lVar36 = lVar36 + sVar8;
          }
          lVar37 = lVar37 + sVar14;
        }
        lVar34 = lVar34 + sVar10 * lVar35;
      }
      local_d0 = local_d0 + sVar15;
    }
  }
  else {
    if (dst->op_params[0] != 1) {
      pcVar26 = "unsupported upscale mode";
      uVar30 = 0x19bf;
      goto LAB_0013faf3;
    }
    uVar32 = pgVar3->ne[1] - 1;
    uVar40 = pgVar3->ne[0] - 1;
    local_c8 = sVar10 * lVar33;
    for (uVar25 = 0; uVar25 != (~((long)uVar13 >> 0x3f) & uVar13); uVar25 = uVar25 + 1) {
      lVar37 = (long)((float)(long)uVar25 / fVar44) * sVar5;
      lVar22 = local_c8;
      for (lVar34 = lVar33; lVar34 < lVar6; lVar34 = lVar34 + lVar35) {
        lVar36 = (long)((float)lVar34 / fVar43) * sVar7;
        local_d0 = lVar22;
        for (uVar21 = 0; uVar21 != (~((long)uVar12 >> 0x3f) & uVar12); uVar21 = uVar21 + 1) {
          fVar17 = ((float)(long)uVar21 + 0.5) / fVar42 + -0.5;
          auVar18 = vroundss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),9);
          uVar20 = (ulong)auVar18._0_4_;
          uVar31 = uVar20;
          if ((long)uVar32 < (long)uVar20) {
            uVar31 = uVar32;
          }
          uVar31 = ~((long)uVar31 >> 0x3f) & uVar31;
          uVar23 = uVar20 + 1;
          if ((long)uVar32 < (long)(uVar20 + 1)) {
            uVar23 = uVar32;
          }
          uVar20 = 0;
          auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                               ZEXT416((uint)(fVar17 - (float)(long)uVar31)));
          auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
          fVar17 = 1.0 - auVar18._0_4_;
          lVar24 = local_d0;
          while ((~((long)uVar11 >> 0x3f) & uVar11) != uVar20) {
            fVar45 = ((float)(long)uVar20 + 0.5) / fVar41 + -0.5;
            auVar19 = vroundss_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),9);
            uVar27 = (ulong)auVar19._0_4_;
            uVar28 = uVar40;
            if ((long)uVar27 <= (long)uVar40) {
              uVar28 = uVar27;
            }
            uVar38 = uVar40;
            if ((long)(uVar27 + 1) <= (long)uVar40) {
              uVar38 = uVar27 + 1;
            }
            lVar1 = uVar31 * sVar4 + lVar36;
            uVar20 = uVar20 + 1;
            uVar28 = ~((long)uVar28 >> 0x3f) & uVar28;
            pvVar16 = pgVar3->data;
            lVar29 = uVar28 * sVar9;
            lVar39 = (~((long)uVar38 >> 0x3f) & uVar38) * sVar9;
            lVar2 = (~((long)uVar23 >> 0x3f) & uVar23) * sVar4 + lVar36;
            auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416((uint)(fVar45 - (float)(long)uVar28)));
            auVar19 = vmaxss_avx(auVar19,ZEXT816(0) << 0x40);
            fVar45 = auVar19._0_4_;
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar45 * *(float *)((long)pvVar16 +
                                                                                 lVar37 + lVar1 + 
                                                  lVar39))),ZEXT416((uint)fVar17),
                                      ZEXT416((uint)((1.0 - fVar45) *
                                                    *(float *)((long)pvVar16 +
                                                              lVar37 + lVar1 + lVar29))));
            auVar19 = vfmadd213ss_fma(ZEXT416((uint)((1.0 - fVar45) *
                                                    *(float *)((long)pvVar16 +
                                                              lVar37 + lVar2 + lVar29))),auVar18,
                                      auVar19);
            auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar45 * *(float *)((long)pvVar16 +
                                                                        lVar37 + lVar2 + lVar39))),
                                      auVar18,auVar19);
            *(int *)((long)dst->data + lVar24) = auVar19._0_4_;
            lVar24 = lVar24 + sVar8;
          }
          local_d0 = local_d0 + sVar14;
        }
        lVar22 = lVar22 + sVar10 * lVar35;
      }
      local_c8 = local_c8 + sVar15;
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_upscale(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_upscale_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}